

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O3

void __thiscall
yactfr::internal::JsonStructMemberTypeValReq::JsonStructMemberTypeValReq
          (JsonStructMemberTypeValReq *this,JsonAnyFullDtValReq *anyFullDtValReq)

{
  bool in_DL;
  long lVar1;
  undefined1 local_164;
  undefined1 local_163;
  undefined1 local_162;
  allocator local_161;
  string local_160;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_140;
  PropReqsEntry local_108;
  PropReqsEntry local_d0 [2];
  undefined8 local_60 [2];
  long local_50 [4];
  undefined8 uStack_30;
  
  (anonymous_namespace)::namePropReqEntry_abi_cxx11_(&local_108,(_anonymous_namespace_ *)0x1,in_DL);
  std::__cxx11::string::string((string *)&local_160,"field-class",&local_161);
  anon_unknown_0::anyDtPropReqEntry(local_d0,&local_160,anyFullDtValReq,true);
  (anonymous_namespace)::attrsPropReqEntry_abi_cxx11_();
  (anonymous_namespace)::extPropReqEntry_abi_cxx11_();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_140,&local_108,&stack0xffffffffffffffd8,0,&local_162,&local_163,&local_164);
  JsonObjValReq::JsonObjValReq(&this->super_JsonObjValReq,(PropReqs *)&local_140,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_140);
  lVar1 = 0;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_30 + lVar1) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_30 + lVar1));
    }
    if ((void *)((long)local_50 + lVar1) != *(void **)((long)local_60 + lVar1)) {
      operator_delete(*(void **)((long)local_60 + lVar1),*(long *)((long)local_50 + lVar1) + 1);
    }
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0xe0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  (this->super_JsonObjValReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonObjValReq_002fc608;
  return;
}

Assistant:

explicit JsonStructMemberTypeValReq(const JsonAnyFullDtValReq& anyFullDtValReq) :
        JsonObjValReq {{
            namePropReqEntry(true),
            anyDtPropReqEntry(strs::fc, anyFullDtValReq, true),
            attrsPropReqEntry(),
            extPropReqEntry(),
        }}
    {
    }